

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

Option * __thiscall
kj::MainBuilder::Impl::addOption
          (Impl *this,initializer_list<kj::MainBuilder::OptionName> names,bool hasArg,
          StringPtr helpText)

{
  size_t *this_00;
  undefined7 uVar1;
  bool bVar2;
  Option *this_01;
  size_type size;
  const_iterator pOVar3;
  OptionName *pOVar4;
  ArrayPtr<kj::MainBuilder::OptionName> AVar5;
  __enable_if_t<is_constructible<value_type,_pair<ArrayPtr<const_char>,_Option_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  pair<char,_kj::MainBuilder::Impl::Option_*> pVar7;
  __enable_if_t<is_constructible<value_type,_pair<char,_Option_*>_>::value,_pair<iterator,_bool>_>
  _Var8;
  Fault local_188;
  Fault f_2;
  Option *local_170;
  pair<char,_kj::MainBuilder::Impl::Option_*> local_168;
  _Base_ptr local_158;
  bool local_150 [15];
  DebugExpression<bool> local_141;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  Option *local_128;
  StringPtr local_120;
  ArrayPtr<const_char> local_110;
  pair<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> local_100;
  _Base_ptr local_e8;
  bool local_e0 [15];
  DebugExpression<bool> local_d1;
  const_iterator pOStack_d0;
  DebugExpression<bool> _kjCondition_1;
  OptionName *name;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<kj::MainBuilder::OptionName> *__range2;
  OptionName *pOStack_a8;
  uint i;
  size_t local_a0;
  Option *option;
  Fault local_80;
  Fault f;
  size_type local_70;
  DebugExpression<unsigned_long> local_68;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  bool hasArg_local;
  Impl *this_local;
  StringPtr helpText_local;
  initializer_list<kj::MainBuilder::OptionName> names_local;
  
  helpText_local.content.ptr = (char *)helpText.content.size_;
  helpText_local.content.size_ = (size_t)names._M_array;
  _kjCondition._39_1_ = hasArg;
  local_70 = std::initializer_list<kj::MainBuilder::OptionName>::size
                       ((initializer_list<kj::MainBuilder::OptionName> *)
                        &helpText_local.content.size_);
  local_68 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_60,&local_68,
             (int *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[35]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x118,FAILED,"names.size() > 0",
               "_kjCondition,\"option must have at least one name\"",
               (DebugComparison<unsigned_long,_int> *)local_60,
               (char (*) [35])"option must have at least one name");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  this_01 = Arena::allocate<kj::MainBuilder::Impl::Option>(&this->arena);
  size = std::initializer_list<kj::MainBuilder::OptionName>::size
                   ((initializer_list<kj::MainBuilder::OptionName> *)&helpText_local.content.size_);
  AVar5 = Arena::allocateArray<kj::MainBuilder::OptionName>(&this->arena,size);
  pOStack_a8 = AVar5.ptr;
  (this_01->names).ptr = pOStack_a8;
  local_a0 = AVar5.size_;
  (this_01->names).size_ = local_a0;
  __range2._4_4_ = 0;
  this_00 = &helpText_local.content.size_;
  __end2 = std::initializer_list<kj::MainBuilder::OptionName>::begin
                     ((initializer_list<kj::MainBuilder::OptionName> *)this_00);
  pOVar3 = std::initializer_list<kj::MainBuilder::OptionName>::end
                     ((initializer_list<kj::MainBuilder::OptionName> *)this_00);
  do {
    if (__end2 == pOVar3) {
      this_01->hasArg = (bool)(_kjCondition._39_1_ & 1);
      (this_01->helpText).content.ptr = helpText.content.ptr;
      (this_01->helpText).content.size_ = (size_t)helpText_local.content.ptr;
      return this_01;
    }
    pOStack_d0 = __end2;
    pOVar4 = ArrayPtr<kj::MainBuilder::OptionName>::operator[]
                       (&this_01->names,(ulong)__range2._4_4_);
    uVar1 = *(undefined7 *)&__end2->field_0x1;
    pOVar4->isLong = __end2->isLong;
    *(undefined7 *)&pOVar4->field_0x1 = uVar1;
    pOVar4->field_1 = __end2->field_1;
    if ((pOStack_d0->isLong & 1U) == 0) {
      local_170 = this_01;
      pVar7 = std::make_pair<char_const&,kj::MainBuilder::Impl::Option*>
                        (&(pOStack_d0->field_1).shortName,&local_170);
      local_168.second = pVar7.second;
      local_168.first = pVar7.first;
      _Var8 = std::
              map<char,kj::MainBuilder::Impl::Option*,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
              ::insert<std::pair<char,kj::MainBuilder::Impl::Option*>>
                        ((map<char,kj::MainBuilder::Impl::Option*,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->shortOptions,&local_168);
      f_2.exception = (Exception *)_Var8.first._M_node;
      local_150[0] = _Var8.second;
      local_158 = (_Base_ptr)f_2.exception;
      local_141 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_150);
      bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_141);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[17],char_const&>
                  (&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
                   ,0x126,FAILED,
                   "shortOptions.insert(std::make_pair(name.shortName, &option)).second",
                   "_kjCondition,\"duplicate option\", name.shortName",&local_141,
                   (char (*) [17])"duplicate option",&(pOStack_d0->field_1).shortName);
        kj::_::Debug::Fault::fatal(&local_188);
      }
    }
    else {
      StringPtr::StringPtr(&local_120,(pOStack_d0->field_1).longName);
      local_110 = StringPtr::asArray(&local_120);
      local_128 = this_01;
      std::make_pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>
                (&local_100,&local_110,&local_128);
      _Var6 = std::
              map<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*,std::less<kj::ArrayPtr<char_const>>,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
              ::insert<std::pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>>
                        ((map<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*,std::less<kj::ArrayPtr<char_const>>,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->longOptions,&local_100);
      local_e8 = (_Base_ptr)_Var6.first._M_node;
      local_e0[0] = _Var6.second;
      local_d1 = kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_e0);
      bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_d1);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[17],char_const*const&>
                  ((Fault *)&stack0xfffffffffffffec0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
                   ,0x122,FAILED,
                   "longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second"
                   ,"_kjCondition,\"duplicate option\", name.longName",&local_d1,
                   (char (*) [17])"duplicate option",&(pOStack_d0->field_1).longName);
        kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffec0);
      }
    }
    __end2 = __end2 + 1;
    __range2._4_4_ = __range2._4_4_ + 1;
  } while( true );
}

Assistant:

Option& addOption(std::initializer_list<OptionName> names, bool hasArg, StringPtr helpText) {
    KJ_REQUIRE(names.size() > 0, "option must have at least one name");

    Option& option = arena.allocate<Option>();
    option.names = arena.allocateArray<OptionName>(names.size());
    uint i = 0;
    for (auto& name: names) {
      option.names[i++] = name;
      if (name.isLong) {
        KJ_REQUIRE(
            longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second,
            "duplicate option", name.longName);
      } else {
        KJ_REQUIRE(
            shortOptions.insert(std::make_pair(name.shortName, &option)).second,
            "duplicate option", name.shortName);
      }
    }
    option.hasArg = hasArg;
    option.helpText = helpText;
    return option;
  }